

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nasm_cfg.cpp
# Opt level: O0

void __thiscall mocker::NasmCfg::addNode(NasmCfg *this,LineIter beg,LineIter end)

{
  byte bVar1;
  pointer pLVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>,_false,_true>,_bool>
  pVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>
  local_e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>,_true>
  local_98;
  byte local_90;
  byte local_85;
  bool success;
  _List_node_base *local_78;
  _List_node_base *local_70;
  undefined1 local_68 [8];
  Node node;
  string label;
  NasmCfg *this_local;
  LineIter end_local;
  LineIter beg_local;
  
  end_local = beg;
  pLVar2 = std::_List_const_iterator<mocker::nasm::Line>::operator->(&end_local);
  std::__cxx11::string::string
            ((string *)
             &node.succs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pLVar2);
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!label.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/nasm_cfg.cpp"
                  ,0xb,"void mocker::NasmCfg::addNode(LineIter, LineIter)");
  }
  local_70 = end_local._M_node;
  local_78 = end._M_node;
  Node::Node((Node *)local_68,end_local,end);
  std::make_pair<std::__cxx11::string&,mocker::NasmCfg::Node>
            (&local_e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &node.succs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Node *)local_68);
  pVar3 = std::
          unordered_map<std::__cxx11::string,mocker::NasmCfg::Node,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mocker::NasmCfg::Node>>>
          ::emplace<std::pair<std::__cxx11::string,mocker::NasmCfg::Node>>
                    ((unordered_map<std::__cxx11::string,mocker::NasmCfg::Node,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mocker::NasmCfg::Node>>>
                      *)this,&local_e0);
  local_98._M_cur =
       (__node_type *)
       pVar3.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>,_true>
       ._M_cur;
  local_90 = pVar3.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>
  ::~pair(&local_e0);
  local_85 = pVar3.second & 1;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    Node::~Node((Node *)local_68);
    std::__cxx11::string::~string
              ((string *)
               &node.succs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  __assert_fail("success",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/nasm_cfg.cpp"
                ,0xe,"void mocker::NasmCfg::addNode(LineIter, LineIter)");
}

Assistant:

void NasmCfg::addNode(LineIter beg, LineIter end) {
  auto label = beg->label;
  assert(!label.empty());
  Node node{beg, end};
  auto success = nodes.emplace(std::make_pair(label, std::move(node))).second;
  assert(success);
}